

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_multiple_data_objects.c
# Opt level: O1

wchar_t file_open(archive *a,void *client_data)

{
  wchar_t wVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  wchar_t *pwVar5;
  char *fmt;
  char *mbs;
  wchar_t *wcs;
  stat st;
  wchar_t *local_c8;
  wchar_t *local_c0;
  stat local_b8;
  
  local_c8 = (wchar_t *)0x0;
  local_c0 = (wchar_t *)0x0;
  wVar1 = archive_mstring_get_mbs(a,(archive_mstring *)((long)client_data + 8),(char **)&local_c8);
  if (wVar1 == L'\0') {
    iVar2 = open((char *)local_c8,0x80241,0x1b6);
    *(int *)client_data = iVar2;
    __archive_ensure_cloexec_flag(iVar2);
    pwVar5 = local_c8;
    if (*client_data < 0) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if (pwVar5 == (wchar_t *)0x0) {
        fmt = "Failed to open \'%S\'";
        pwVar5 = local_c0;
      }
      else {
        fmt = "Failed to open \'%s\'";
      }
    }
    else {
      iVar2 = fstat(*client_data,&local_b8);
      pwVar5 = local_c8;
      if (iVar2 == 0) {
        iVar2 = archive_write_get_bytes_in_last_block(a);
        if (iVar2 < 0) {
          uVar3 = local_b8.st_mode & 0xf000;
          iVar2 = 0;
          if (((uVar3 != 0x1000) && (iVar2 = 0, uVar3 != 0x2000)) && (iVar2 = 0, uVar3 != 0x6000)) {
            iVar2 = 1;
          }
          archive_write_set_bytes_in_last_block(a,iVar2);
        }
        if ((local_b8.st_mode & 0xf000) == 0x8000) {
          archive_write_set_skip_file(a,local_b8.st_dev,local_b8.st_ino);
          return L'\0';
        }
        return L'\0';
      }
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if (pwVar5 == (wchar_t *)0x0) {
        fmt = "Couldn\'t stat \'%S\'";
        pwVar5 = local_c0;
      }
      else {
        fmt = "Couldn\'t stat \'%s\'";
      }
    }
  }
  else {
    piVar4 = __errno_location();
    if (*piVar4 == 0xc) {
      archive_set_error(a,0xc,"No memory");
      return L'\xffffffe2';
    }
    archive_mstring_get_wcs(a,(archive_mstring *)((long)client_data + 8),&local_c0);
    iVar2 = *piVar4;
    fmt = "Can\'t convert \'%S\' to MBS";
    pwVar5 = local_c0;
  }
  archive_set_error(a,iVar2,fmt,pwVar5);
  return L'\xffffffe2';
}

Assistant:

static int
file_open(struct archive *a, void *data)
{
  struct mydata *mydata = (struct mydata *)data;
  (void)a;
  if (mydata->fd < 0)
  {
    mydata->fd = open(mydata->filename, O_RDONLY | O_BINARY);
    if (mydata->fd >= 0)
    {
      if ((mydata->buffer = (void*)calloc(1, BLOCK_SIZE)) == NULL)
        return (ARCHIVE_FAILED);
    }
  }
  return (ARCHIVE_OK);
}